

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

size_t webrtc::ReadInt16FromFileToDoubleBuffer(FileWrapper *file,size_t length,double *buffer)

{
  uint uVar1;
  short *__p;
  pointer buffer_00;
  type psVar2;
  ulong uVar3;
  FileWrapper *local_50;
  size_t i;
  size_t int16s_read;
  unique_ptr<short[],_std::default_delete<short[]>_> buffer16;
  double *buffer_local;
  size_t length_local;
  FileWrapper *file_local;
  
  if ((((file == (FileWrapper *)0x0) ||
       (buffer16._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
        super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
        super__Head_base<0UL,_short_*,_false>._M_head_impl =
             (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)
             (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)buffer,
       uVar1 = (*(file->super_InStream)._vptr_InStream[4])(), (uVar1 & 1) == 0)) ||
      ((__uniq_ptr_impl<short,_std::default_delete<short[]>_>)
       buffer16._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
       super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
       super__Head_base<0UL,_short_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)0x0)) || (length == 0)) {
    file_local = (FileWrapper *)0x0;
  }
  else {
    uVar3 = length * 2;
    if (CARRY8(length,length)) {
      uVar3 = 0xffffffffffffffff;
    }
    __p = (short *)operator_new__(uVar3);
    std::unique_ptr<short[],std::default_delete<short[]>>::
    unique_ptr<short*,std::default_delete<short[]>,void,bool>
              ((unique_ptr<short[],std::default_delete<short[]>> *)&int16s_read,__p);
    buffer_00 = std::unique_ptr<short[],_std::default_delete<short[]>_>::get
                          ((unique_ptr<short[],_std::default_delete<short[]>_> *)&int16s_read);
    file_local = (FileWrapper *)ReadInt16BufferFromFile(file,length,buffer_00);
    for (local_50 = (FileWrapper *)0x0; local_50 < file_local;
        local_50 = (FileWrapper *)((long)&(local_50->super_InStream)._vptr_InStream + 1)) {
      psVar2 = std::unique_ptr<short[],_std::default_delete<short[]>_>::operator[]
                         ((unique_ptr<short[],_std::default_delete<short[]>_> *)&int16s_read,
                          (size_t)local_50);
      *(double *)
       ((long)buffer16._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
              super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
              super__Head_base<0UL,_short_*,_false>._M_head_impl + (long)local_50 * 8) =
           (double)(int)*psVar2;
    }
    std::unique_ptr<short[],_std::default_delete<short[]>_>::~unique_ptr
              ((unique_ptr<short[],_std::default_delete<short[]>_> *)&int16s_read);
  }
  return (size_t)file_local;
}

Assistant:

size_t ReadInt16FromFileToDoubleBuffer(FileWrapper* file,
                                       size_t length,
                                       double* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<int16_t[]> buffer16(new int16_t[length]);

  size_t int16s_read = ReadInt16BufferFromFile(file, length, buffer16.get());

  for (size_t i = 0; i < int16s_read; ++i) {
    buffer[i] = buffer16[i];
  }

  return int16s_read;
}